

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O2

void rtosc_v2args(rtosc_arg_t *args,size_t nargs,char *arg_str,rtosc_va_list_t *ap)

{
  char cVar1;
  uint uVar2;
  uint8_t *puVar3;
  int iVar4;
  int32_t *piVar5;
  double *pdVar6;
  undefined8 *puVar7;
  ulong uVar8;
  long lVar9;
  
  uVar8 = 0;
switchD_001027ae_caseD_65:
  if (nargs <= uVar8) {
    return;
  }
  cVar1 = *arg_str;
  arg_str = arg_str + 1;
  iVar4 = (int)uVar8;
  switch(cVar1) {
  case 'b':
    uVar2 = ap->a[0].gp_offset;
    if ((ulong)uVar2 < 0x29) {
      piVar5 = (int32_t *)((ulong)uVar2 + (long)ap->a[0].reg_save_area);
      ap->a[0].gp_offset = uVar2 + 8;
    }
    else {
      piVar5 = (int32_t *)ap->a[0].overflow_arg_area;
      ap->a[0].overflow_arg_area = piVar5 + 2;
    }
    args[uVar8].i = *piVar5;
    uVar2 = ap->a[0].gp_offset;
    if ((ulong)uVar2 < 0x29) {
      puVar7 = (undefined8 *)((ulong)uVar2 + (long)ap->a[0].reg_save_area);
      ap->a[0].gp_offset = uVar2 + 8;
    }
    else {
      puVar7 = (undefined8 *)ap->a[0].overflow_arg_area;
      ap->a[0].overflow_arg_area = puVar7 + 1;
    }
    (&args->b)[uVar8].data = (uint8_t *)*puVar7;
    uVar8 = (ulong)(iVar4 + 1);
    goto switchD_001027ae_caseD_65;
  case 'c':
  case 'i':
  case 'r':
    uVar2 = ap->a[0].gp_offset;
    if ((ulong)uVar2 < 0x29) {
      piVar5 = (int32_t *)((ulong)uVar2 + (long)ap->a[0].reg_save_area);
      ap->a[0].gp_offset = uVar2 + 8;
    }
    else {
      piVar5 = (int32_t *)ap->a[0].overflow_arg_area;
      ap->a[0].overflow_arg_area = piVar5 + 2;
    }
    args[uVar8].i = *piVar5;
    uVar8 = (ulong)(iVar4 + 1);
    goto switchD_001027ae_caseD_65;
  case 'd':
    uVar2 = ap->a[0].fp_offset;
    if ((ulong)uVar2 < 0xa1) {
      pdVar6 = (double *)((ulong)uVar2 + (long)ap->a[0].reg_save_area);
      ap->a[0].fp_offset = uVar2 + 0x10;
    }
    else {
      pdVar6 = (double *)ap->a[0].overflow_arg_area;
      ap->a[0].overflow_arg_area = pdVar6 + 1;
    }
    args[uVar8].d = *pdVar6;
    uVar8 = (ulong)(iVar4 + 1);
  case 'e':
  case 'g':
  case 'j':
  case 'k':
  case 'l':
  case 'n':
  case 'o':
  case 'p':
  case 'q':
    goto switchD_001027ae_caseD_65;
  case 'f':
    uVar2 = ap->a[0].fp_offset;
    if ((ulong)uVar2 < 0xa1) {
      pdVar6 = (double *)((ulong)uVar2 + (long)ap->a[0].reg_save_area);
      ap->a[0].fp_offset = uVar2 + 0x10;
    }
    else {
      pdVar6 = (double *)ap->a[0].overflow_arg_area;
      ap->a[0].overflow_arg_area = pdVar6 + 1;
    }
    args[uVar8].f = (float)*pdVar6;
    uVar8 = (ulong)(iVar4 + 1);
    goto switchD_001027ae_caseD_65;
  case 'm':
    uVar2 = ap->a[0].gp_offset;
    if ((ulong)uVar2 < 0x29) {
      puVar7 = (undefined8 *)((ulong)uVar2 + (long)ap->a[0].reg_save_area);
      ap->a[0].gp_offset = uVar2 + 8;
    }
    else {
      puVar7 = (undefined8 *)ap->a[0].overflow_arg_area;
      ap->a[0].overflow_arg_area = puVar7 + 1;
    }
    puVar3 = (uint8_t *)*puVar7;
    lVar9 = uVar8 * 0x10;
    args[uVar8].m[0] = *puVar3;
    args->m[lVar9 + 1] = puVar3[1];
    args->m[lVar9 + 2] = puVar3[2];
    args->m[lVar9 + 3] = puVar3[3];
    uVar8 = (ulong)(iVar4 + 1);
    goto switchD_001027ae_caseD_65;
  default:
    if (cVar1 != 'S') goto switchD_001027ae_caseD_65;
  case 'h':
  case 's':
  case 't':
    uVar2 = ap->a[0].gp_offset;
    if ((ulong)uVar2 < 0x29) {
      pdVar6 = (double *)((ulong)uVar2 + (long)ap->a[0].reg_save_area);
      ap->a[0].gp_offset = uVar2 + 8;
    }
    else {
      pdVar6 = (double *)ap->a[0].overflow_arg_area;
      ap->a[0].overflow_arg_area = pdVar6 + 1;
    }
    args[uVar8].d = *pdVar6;
    uVar8 = (ulong)(iVar4 + 1);
    goto switchD_001027ae_caseD_65;
  }
}

Assistant:

static void rtosc_v2args(rtosc_arg_t* args, size_t nargs, const char* arg_str,
                         rtosc_va_list_t* ap)
{
    unsigned arg_pos = 0;
    uint8_t *midi_tmp;

    while(arg_pos < nargs)
    {
        switch(*arg_str++) {
            case 'h':
            case 't':
                args[arg_pos++].h = va_arg(ap->a, int64_t);
                break;
            case 'd':
                args[arg_pos++].d = va_arg(ap->a, double);
                break;
            case 'c':
            case 'i':
            case 'r':
                args[arg_pos++].i = va_arg(ap->a, int);
                break;
            case 'm':
                midi_tmp = va_arg(ap->a, uint8_t *);
                args[arg_pos].m[0] = midi_tmp[0];
                args[arg_pos].m[1] = midi_tmp[1];
                args[arg_pos].m[2] = midi_tmp[2];
                args[arg_pos++].m[3] = midi_tmp[3];
                break;
            case 'S':
            case 's':
                args[arg_pos++].s = va_arg(ap->a, const char *);
                break;
            case 'b':
                args[arg_pos].b.len = va_arg(ap->a, int);
                args[arg_pos].b.data = va_arg(ap->a, unsigned char *);
                arg_pos++;
                break;
            case 'f':
                args[arg_pos++].f = va_arg(ap->a, double);
                break;
            default:
                ;
        }
    }
}